

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

int beta_binomial_sample(double a,double b,int c,int *seed)

{
  int iVar1;
  double cdf_00;
  int x;
  double cdf;
  int *seed_local;
  int c_local;
  double b_local;
  double a_local;
  
  cdf_00 = r8_uniform_01(seed);
  iVar1 = beta_binomial_cdf_inv(cdf_00,a,b,c);
  return iVar1;
}

Assistant:

int beta_binomial_sample ( double a, double b, int c, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_BINOMIAL_SAMPLE samples the Beta Binomial CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input, int C, a parameter of the PDF.
//    0 <= C.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int BETA_BINOMIAL_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int x;

  cdf = r8_uniform_01 ( seed );

  x = beta_binomial_cdf_inv ( cdf, a, b, c );

  return x;
}